

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_a.h
# Opt level: O0

void arena_internal_sub(arena_t *arena,size_t size)

{
  atomic_zu_t *paVar1;
  size_t size_local;
  arena_t *arena_local;
  
  paVar1 = &(arena->stats).internal;
  LOCK();
  paVar1->repr = paVar1->repr - size;
  UNLOCK();
  return;
}

Assistant:

static inline void
arena_internal_sub(arena_t *arena, size_t size) {
	atomic_fetch_sub_zu(&arena->stats.internal, size, ATOMIC_RELAXED);
}